

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O0

void SipHashRound(uint64_t *v0,uint64_t *v1,uint64_t *v2,uint64_t *v3)

{
  long lVar1;
  uint64_t uVar2;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  ulong *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = *in_RDI + *in_RSI;
  uVar2 = Rot<13>((uint64_t)in_RCX);
  *in_RSI = uVar2;
  *in_RSI = *in_RSI ^ *in_RDI;
  uVar2 = Rot<32>((uint64_t)in_RCX);
  *in_RDI = uVar2;
  *in_RDX = *in_RDX + *in_RCX;
  uVar2 = Rot<16>((uint64_t)in_RCX);
  *in_RCX = uVar2;
  *in_RCX = *in_RCX ^ *in_RDX;
  *in_RDI = *in_RDI + *in_RCX;
  uVar2 = Rot<21>((uint64_t)in_RCX);
  *in_RCX = uVar2;
  *in_RCX = *in_RCX ^ *in_RDI;
  *in_RDX = *in_RDX + *in_RSI;
  uVar2 = Rot<17>((uint64_t)in_RCX);
  *in_RSI = uVar2;
  *in_RSI = *in_RSI ^ *in_RDX;
  uVar2 = Rot<32>((uint64_t)in_RCX);
  *in_RDX = uVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void SipHashRound(uint64_t& v0, uint64_t& v1, uint64_t& v2, uint64_t& v3) {
    v0 += v1; v1 = Rot<13>(v1); v1 ^= v0;
    v0 = Rot<32>(v0);
    v2 += v3; v3 = Rot<16>(v3); v3 ^= v2;
    v0 += v3; v3 = Rot<21>(v3); v3 ^= v0;
    v2 += v1; v1 = Rot<17>(v1); v1 ^= v2;
    v2 = Rot<32>(v2);
}